

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth2-server.c
# Opt level: O0

void ssh2_userauth_server_free(PacketProtocolLayer *ppl)

{
  ssh2_userauth_server_state *s;
  PacketProtocolLayer *ppl_local;
  
  if (*(long *)&ppl[-2].remote_bugs != 0) {
    ssh_ppl_free(*(PacketProtocolLayer **)&ppl[-2].remote_bugs);
  }
  free_auth_kbdint(*(AuthKbdInt **)&ppl[-1].remote_bugs);
  safefree(&ppl[-2].interactor);
  return;
}

Assistant:

static void ssh2_userauth_server_free(PacketProtocolLayer *ppl)
{
    struct ssh2_userauth_server_state *s =
        container_of(ppl, struct ssh2_userauth_server_state, ppl);

    if (s->successor_layer)
        ssh_ppl_free(s->successor_layer);

    free_auth_kbdint(s->aki);

    sfree(s);
}